

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picotls.h
# Opt level: O2

uint32_t ptls_log_point_maybe_active(st_ptls_log_point_t *point)

{
  if ((point->state).generation != ptls_log._generation) {
    ptls_log__recalc_point(0,point);
  }
  return (point->state).active_conns;
}

Assistant:

inline uint32_t ptls_log_point_maybe_active(struct st_ptls_log_point_t *point)
{
#if PTLS_HAVE_LOG
    if (PTLS_UNLIKELY(point->state.generation != ptls_log._generation))
        ptls_log__recalc_point(0, point);
    return point->state.active_conns;
#else
    return 0;
#endif
}